

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasmtool.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  long in_FS_OFFSET;
  char **argv_local;
  int argc_local;
  DISASM_OPTIONS options;
  
  options._320_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  memset(&argc_local,0,0x148);
  _Var1 = parse_arguments(argc,argv,(DISASM_OPTIONS *)&argc_local);
  if (_Var1) {
    if (argc_local == 2) {
      handle_shemu((PDISASM_OPTIONS)&argc_local);
    }
    else {
      handle_disasm((PDISASM_OPTIONS)&argc_local);
    }
    cleanup_context((DISASM_OPTIONS *)&argc_local);
    argv_local._4_4_ = 0;
  }
  else {
    argv_local._4_4_ = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == options._320_8_) {
    return argv_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int 
main(
    _In_ int argc, 
    _In_ char* argv[]
    )
{
    DISASM_OPTIONS options = { 0 };

    // Parse arguments & extract relevant options.
    if (!parse_arguments(argc, argv, &options))
    {
        return -1;
    }

    // Handle the indicated command.
    if (options.Command == commandShemu)
    {
        handle_shemu(&options);
    }
    else
    {
        handle_disasm(&options);
    }

    // Will free any memory allocated during argument parsing, and will close any handles.
    cleanup_context(&options);

    return 0;
}